

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::resolveProcessorInstance
          (QualifiedIdentifierResolver *this,CallOrCast *call,ProcessorBase *p)

{
  size_t sVar1;
  pool_ptr<soul::AST::Expression> local_8;
  
  local_8.object = &((call->super_CallOrCastBase).arguments.object)->super_Expression;
  if ((CommaSeparatedList *)local_8.object == (CommaSeparatedList *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = (((CommaSeparatedList *)local_8.object)->items).numActive;
  }
  if ((long)(p->super_ModuleBase).specialisationParams.
            super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(p->super_ModuleBase).specialisationParams.
            super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 == sVar1) {
    call = (CallOrCast *)
           getOrCreateImplicitProcessorInstance
                     (this,&(call->super_CallOrCastBase).super_Expression.super_Statement.
                            super_ASTObject.context,p,&local_8);
  }
  return (Expression *)call;
}

Assistant:

AST::Expression& resolveProcessorInstance (AST::CallOrCast& call, AST::ProcessorBase& p)
        {
            if (p.specialisationParams.size() == call.getNumArguments())
                return getOrCreateImplicitProcessorInstance (call.context, p, call.arguments);

            return call;
        }